

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  fdb_kvs_handle *handle_00;
  bool bVar1;
  file_status_t fVar2;
  fdb_kvs_handle *__ptr;
  fdb_seqnum_t in_RSI;
  fdb_kvs_handle **in_RDI;
  file_status_t fstatus;
  uint sleep_time;
  fdb_seqnum_t old_seqnum;
  fdb_status fs;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *handle_in;
  fdb_config config;
  fdb_config *in_stack_00001b40;
  fdb_filename_mode_t in_stack_00001b4c;
  char *in_stack_00001b50;
  fdb_kvs_handle *in_stack_00001b58;
  fdb_kvs_handle *in_stack_fffffffffffffeb8;
  undefined2 uVar3;
  uint8_t initial;
  filemgr *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  fdb_status local_124;
  undefined1 local_110 [120];
  fdb_kvs_handle *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff86;
  fdb_commit_opt_t in_stack_ffffffffffffff87;
  fdb_kvs_handle *in_stack_ffffffffffffff88;
  fdb_status local_4;
  
  if (in_RDI == (fdb_kvs_handle **)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle_00 = *in_RDI;
    if (handle_00 == (fdb_kvs_handle *)0x0) {
      local_4 = FDB_RESULT_INVALID_HANDLE;
    }
    else {
      memcpy(local_110,&handle_00->config,0xf8);
      if (handle_00->kvs == (kvs_info *)0x0) {
        if (((handle_00->config).flags & 2) == 0) {
          bVar1 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,
                                     (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                                     (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
          if (bVar1) {
            filemgr_mutex_lock((filemgr *)0x137f95);
            filemgr_set_rollback
                      (in_stack_fffffffffffffec0,(uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38)
                      );
            bVar1 = wal_txn_exists((filemgr *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            if (bVar1) {
              filemgr_set_rollback
                        (in_stack_fffffffffffffec0,
                         (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
              uVar3 = (undefined2)((ulong)in_stack_fffffffffffffeb8 >> 0x30);
              filemgr_mutex_unlock((filemgr *)0x137fda);
              atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,
                                 (uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
              local_4 = FDB_RESULT_FAIL_BY_TRANSACTION;
            }
            else {
              fVar2 = filemgr_get_file_status((filemgr *)0x138018);
              while (fVar2 == '\x01') {
                filemgr_mutex_unlock((filemgr *)0x138034);
                decaying_usleep((uint *)in_stack_fffffffffffffec0,
                                (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
                filemgr_mutex_lock((filemgr *)0x138051);
                fVar2 = filemgr_get_file_status((filemgr *)0x13805f);
              }
              if (fVar2 == '\x04') {
                filemgr_mutex_unlock((filemgr *)0x13807d);
                fdb_check_file_reopen(handle_00,(file_status_t *)0x0);
              }
              else {
                filemgr_mutex_unlock((filemgr *)0x13809b);
              }
              fdb_sync_db_header(in_stack_ffffffffffffff68);
              if (handle_00->seqnum < in_RSI) {
                filemgr_set_rollback
                          (in_stack_fffffffffffffec0,
                           (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
                atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,
                                   (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                                   (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
                local_4 = FDB_RESULT_NO_DB_INSTANCE;
              }
              else {
                __ptr = (fdb_kvs_handle *)calloc(1,0x208);
                initial = (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
                if (__ptr == (fdb_kvs_handle *)0x0) {
                  atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,initial,
                                     (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
                  local_4 = FDB_RESULT_ALLOC_FAIL;
                }
                else {
                  atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,initial);
                  (__ptr->log_callback).callback = (handle_00->log_callback).callback;
                  (__ptr->log_callback).callback_ex = (handle_00->log_callback).callback_ex;
                  (__ptr->log_callback).ctx_data = (handle_00->log_callback).ctx_data;
                  __ptr->fhandle = handle_00->fhandle;
                  if (in_RSI == 0) {
                    local_124 = _fdb_reset((fdb_kvs_handle *)config.compaction_minimum_filesize,
                                           (fdb_kvs_handle *)config._40_8_);
                  }
                  else {
                    __ptr->max_seqnum = in_RSI;
                    local_124 = _fdb_open(in_stack_00001b58,in_stack_00001b50,in_stack_00001b4c,
                                          in_stack_00001b40);
                  }
                  filemgr_set_rollback
                            (in_stack_fffffffffffffec0,
                             (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
                  if (local_124 == FDB_RESULT_SUCCESS) {
                    filemgr_mutex_lock((filemgr *)0x138211);
                    filemgr_get_seqnum((filemgr *)0x13821f);
                    filemgr_set_seqnum(in_stack_fffffffffffffec0,
                                       (fdb_seqnum_t)in_stack_fffffffffffffeb8);
                    filemgr_mutex_unlock((filemgr *)0x138248);
                    local_124 = _fdb_commit(in_stack_ffffffffffffff88,in_stack_ffffffffffffff87,
                                            (bool)in_stack_ffffffffffffff86);
                    if (local_124 == FDB_RESULT_SUCCESS) {
                      if (handle_00->txn != (fdb_txn *)0x0) {
                        __ptr->txn = handle_00->txn;
                        handle_00->txn = (fdb_txn *)0x0;
                      }
                      _fdb_kvs_close((fdb_kvs_handle *)in_stack_fffffffffffffec0);
                      free(handle_00);
                      _fdb_kvs_createNLinkKVHandle
                                ((fdb_file_handle *)in_stack_fffffffffffffec0,
                                 in_stack_fffffffffffffeb8);
                      __ptr->max_seqnum = 0;
                      __ptr->seqnum = in_RSI;
                      *in_RDI = __ptr;
                    }
                    else {
                      filemgr_mutex_lock((filemgr *)0x138325);
                      filemgr_set_seqnum(in_stack_fffffffffffffec0,
                                         (fdb_seqnum_t)in_stack_fffffffffffffeb8);
                      uVar3 = (undefined2)((ulong)in_stack_fffffffffffffeb8 >> 0x30);
                      filemgr_mutex_unlock((filemgr *)0x138346);
                      free(__ptr);
                      atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,
                                         (uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
                    }
                  }
                  else {
                    free(__ptr);
                    atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffec0,
                                       (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                                       (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
                  }
                  local_4 = local_124;
                }
              }
            }
          }
          else {
            local_4 = FDB_RESULT_HANDLE_BUSY;
          }
        }
        else {
          local_4 = fdb_log_impl(&handle_00->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                                 ,"fdb_rollback",0x4cd,
                                 "Warning: Rollback is not allowed on the read-only DB file \'%s\'."
                                 ,handle_00->file->filename);
        }
      }
      else {
        local_4 = fdb_kvs_rollback(in_RDI,in_RSI);
      }
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_kvs_handle *handle_in, *handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    config = handle_in->config;

    if (handle_in->kvs) {
        return fdb_kvs_rollback(handle_ptr, seqnum);
    }

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    if (!atomic_cas_uint8_t(&handle_in->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = handle_in->fhandle;
    if (seqnum == 0) {
        fs = _fdb_reset(handle, handle_in);
    } else {
        handle->max_seqnum = seqnum;
        fs = _fdb_open(handle, handle_in->file->filename, FDB_AFILENAME,
                       &config);
    }

    filemgr_set_rollback(handle_in->file, 0); // allow mutations
    if (fs == FDB_RESULT_SUCCESS) {
        // rollback the file's sequence number
        filemgr_mutex_lock(handle_in->file);
        old_seqnum = filemgr_get_seqnum(handle_in->file);
        filemgr_set_seqnum(handle_in->file, seqnum);
        filemgr_mutex_unlock(handle_in->file);

        fs = _fdb_commit(handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            if (handle_in->txn) {
                handle->txn = handle_in->txn;
                handle_in->txn = NULL;
            }
            // Close, unlink and free the caller's rollback handle.
            _fdb_kvs_close(handle_in);
            free(handle_in);
            // Link the newly opened handle into the file handle's list
            _fdb_kvs_createNLinkKVHandle(handle->fhandle, handle);
            handle->max_seqnum = 0;
            handle->seqnum = seqnum;
            // Set the newly opened rolled-back handle as caller's handle
            *handle_ptr = handle;
        } else {
            // cancel the rolling-back of the sequence number
            filemgr_mutex_lock(handle_in->file);
            filemgr_set_seqnum(handle_in->file, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            free(handle);
            atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        }
    } else {
        free(handle);
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
    }

    return fs;
}